

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O1

value * mjs::parse_value(value *__return_storage_ptr__,gc_heap *h,string *s)

{
  bool bVar1;
  undefined8 uVar2;
  ushort uVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  runtime_error *this;
  long *plVar7;
  wostream *pwVar8;
  undefined1 *rhs;
  ulong uVar9;
  gc_heap *pgVar10;
  bool bVar11;
  uint uVar12;
  wstring res;
  anon_class_16_2_de30df33 require_complete;
  string type;
  string val;
  istringstream iss;
  undefined1 local_3c0 [32];
  anon_class_16_2_de30df33 local_3a0;
  undefined1 *local_390;
  undefined8 local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  string *local_370;
  gc_heap_ptr_untyped *local_368;
  gc_heap *local_360;
  wstring_view local_358 [2];
  gc_heap_ptr_untyped local_338;
  gc_heap local_328 [3];
  wstring_view local_1c0;
  slot local_1b0 [2];
  long local_1a0 [2];
  long local_190;
  long local_188;
  ios_base local_138 [264];
  
  local_360 = h;
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&local_1b0[0].allocation,(string *)s,_S_in);
  local_390 = &local_380;
  local_388 = 0;
  local_380 = 0;
  local_3a0.iss = (istringstream *)local_1b0;
  local_3a0.s = s;
  piVar5 = std::operator>>((istream *)&local_1b0[0].allocation,(string *)&local_390);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0011448b;
  while( true ) {
    lVar6 = local_188 - local_190;
    if (lVar6 == 0) {
      lVar6 = (**(code **)(local_1a0[0] + 0x38))(local_1a0);
    }
    if (lVar6 == 0) break;
    iVar4 = std::istream::peek();
    iVar4 = isblank(iVar4);
    if (iVar4 == 0) break;
    std::istream::get();
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_390);
  if (iVar4 == 0) {
    parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
    rhs = (undefined1 *)&value::undefined;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_390);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_390);
      if (iVar4 == 0) {
        local_338._8_8_ = 0;
        local_328[0].pointers_.set_ =
             (gc_heap_ptr_untyped **)((ulong)local_328[0].pointers_.set_ & 0xffffffffffffff00);
        local_338.heap_ = local_328;
        piVar5 = std::operator>>((istream *)&local_1b0[0].allocation,(string *)&local_338);
        if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
           ((iVar4 = std::__cxx11::string::compare((char *)&local_338), iVar4 != 0 &&
            (iVar4 = std::__cxx11::string::compare((char *)&local_338), iVar4 != 0)))) {
          if (local_338.heap_ != local_328) {
            operator_delete(local_338.heap_,(long)local_328[0].pointers_.set_ + 1);
          }
          goto LAB_00113f9d;
        }
        parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
        iVar4 = std::__cxx11::string::compare((char *)&local_338);
        __return_storage_ptr__->type_ = boolean;
        (__return_storage_ptr__->field_1).b_ = iVar4 == 0;
        if (local_338.heap_ == local_328) goto LAB_001141f8;
LAB_00114455:
        uVar9 = (long)local_328[0].pointers_.set_ + 1;
        pgVar10 = local_338.heap_;
      }
      else {
LAB_00113f9d:
        iVar4 = std::__cxx11::string::compare((char *)&local_390);
        local_370 = s;
        if (iVar4 == 0) {
          lVar6 = local_188 - local_190;
          if (lVar6 == 0) {
            lVar6 = (**(code **)(local_1a0[0] + 0x38))(local_1a0);
          }
          if (lVar6 != 0) {
            iVar4 = std::istream::peek();
            iVar4 = isalpha(iVar4);
            if (iVar4 == 0) {
              piVar5 = std::istream::_M_extract<double>((double *)local_1b0);
              if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
                parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
                __return_storage_ptr__->type_ = number;
                (__return_storage_ptr__->field_1).n_ = (double)local_338.heap_;
                goto LAB_001141f8;
              }
            }
            else {
              local_338._8_8_ = 0;
              local_328[0].pointers_.set_ =
                   (gc_heap_ptr_untyped **)((ulong)local_328[0].pointers_.set_ & 0xffffffffffffff00)
              ;
              local_338.heap_ = local_328;
              piVar5 = std::operator>>((istream *)&local_1b0[0].allocation,(string *)&local_338);
              if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
                parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
                uVar2 = local_338._8_8_;
                pgVar10 = local_338.heap_;
                if (local_338._8_8_ != 0) {
                  lVar6 = 0;
                  do {
                    iVar4 = tolower((int)*(char *)((long)&(pgVar10->pointers_).set_ + lVar6));
                    *(char *)((long)&(pgVar10->pointers_).set_ + lVar6) = (char)iVar4;
                    lVar6 = lVar6 + 1;
                  } while (uVar2 != lVar6);
                }
                iVar4 = std::__cxx11::string::compare((char *)&local_338);
                if (iVar4 == 0) {
                  uVar12 = 0x7ff00000;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_338);
                  s = local_370;
                  if (iVar4 != 0) goto LAB_001142c9;
                  uVar12 = 0x7ff80000;
                }
                __return_storage_ptr__->type_ = number;
                (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.heap_ = (gc_heap *)((ulong)uVar12 << 0x20);
                if (local_338.heap_ == local_328) goto LAB_001141f8;
                goto LAB_00114455;
              }
LAB_001142c9:
              if (local_338.heap_ != local_328) {
                operator_delete(local_338.heap_,(long)local_328[0].pointers_.set_ + 1);
              }
            }
          }
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_390);
        if ((iVar4 != 0) || (iVar4 = std::istream::get(), iVar4 != 0x27)) {
LAB_0011448b:
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c0,"Invalid test spec value \"",s);
          plVar7 = (long *)std::__cxx11::string::append(local_3c0);
          local_338.heap_ = (gc_heap *)*plVar7;
          pgVar10 = (gc_heap *)(plVar7 + 2);
          if (local_338.heap_ == pgVar10) {
            local_328[0].pointers_.set_ = (pgVar10->pointers_).set_;
            local_328[0].pointers_._8_8_ = plVar7[3];
            local_338.heap_ = local_328;
          }
          else {
            local_328[0].pointers_.set_ = (pgVar10->pointers_).set_;
          }
          local_338._8_8_ = plVar7[1];
          *plVar7 = (long)pgVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::runtime_error::runtime_error(this,(string *)&local_338);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_3c0._0_8_ = local_3c0 + 0x10;
        local_3c0._8_8_ = (wchar_t *)0x0;
        local_3c0._16_4_ = 0;
        local_368 = (gc_heap_ptr_untyped *)&__return_storage_ptr__->field_1;
        bVar11 = false;
        do {
          lVar6 = local_188 - local_190;
          if (lVar6 == 0) {
            lVar6 = (**(code **)(local_1a0[0] + 0x38))(local_1a0);
          }
          if (lVar6 == 0) {
            s = local_370;
            if ((gc_heap *)local_3c0._0_8_ != (gc_heap *)(local_3c0 + 0x10)) {
              operator_delete((void *)local_3c0._0_8_,
                              CONCAT44(local_3c0._20_4_,local_3c0._16_4_) * 4 + 4);
              s = local_370;
            }
            goto LAB_0011448b;
          }
          uVar3 = std::istream::get();
          if (bVar11) {
            if (uVar3 < 0x62) {
              if (((uVar3 != 0x22) && (uVar3 != 0x27)) && (uVar3 != 0x5c))
              goto switchD_00114127_caseD_6f;
            }
            else {
              switch(uVar3) {
              case 0x6e:
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
switchD_00114127_caseD_6f:
                std::__cxx11::wostringstream::wostringstream((wostringstream *)&local_338);
                pwVar8 = std::operator<<((wostream *)&local_338,"Not implemented: ");
                pwVar8 = std::operator<<(pwVar8,"Unhandled escape sequence \\");
                std::operator<<(pwVar8,(char)uVar3);
                std::__cxx11::wstringbuf::str();
                local_1c0._M_len = (size_t)local_358[0]._M_str;
                local_1c0._M_str = (wchar_t *)local_358[0]._M_len;
                throw_runtime_error(&local_1c0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                                    ,0x76);
              case 0x72:
                break;
              case 0x74:
                break;
              case 0x75:
                get_escape_sequence((istream *)&local_1b0[0].allocation);
                break;
              case 0x76:
                break;
              default:
                if ((uVar3 != 0x62) && (uVar3 != 0x66)) goto switchD_00114127_caseD_6f;
              }
            }
            std::__cxx11::wstring::push_back((wchar_t)local_3c0);
            bVar1 = true;
            bVar11 = false;
          }
          else if (uVar3 == 0x5c) {
            bVar1 = true;
            bVar11 = true;
          }
          else if (uVar3 == 0x27) {
            parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
            local_358[0]._M_len = local_3c0._8_8_;
            local_358[0]._M_str = (wchar_t *)local_3c0._0_8_;
            string::string((string *)&local_338,local_360,local_358);
            __return_storage_ptr__->type_ = string;
            (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
            super_gc_heap_ptr_untyped.heap_ = local_338.heap_;
            *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_338.pos_;
            if (local_338.heap_ != (gc_heap *)0x0) {
              gc_heap::attach(local_338.heap_,local_368);
            }
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_338);
            bVar1 = false;
          }
          else {
            bVar1 = true;
            std::__cxx11::wstring::push_back((wchar_t)local_3c0);
          }
        } while (bVar1);
        if ((gc_heap *)local_3c0._0_8_ == (gc_heap *)(local_3c0 + 0x10)) goto LAB_001141f8;
        uVar9 = CONCAT44(local_3c0._20_4_,local_3c0._16_4_) * 4 + 4;
        pgVar10 = (gc_heap *)local_3c0._0_8_;
      }
      operator_delete(pgVar10,uVar9);
      goto LAB_001141f8;
    }
    parse_value::anon_class_16_2_de30df33::operator()(&local_3a0);
    rhs = value::null;
  }
  value::value(__return_storage_ptr__,(value *)rhs);
LAB_001141f8:
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0[0].allocation);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

value parse_value(gc_heap& h, const std::string& s) {
    std::istringstream iss{s};
    std::string type;

    auto require_complete = [&]() {
        if (iss.rdbuf()->in_avail()) {
            throw std::runtime_error("Invalid test spec. Parse not complete in \"" + s + "\" Unparsed: \"" + s.substr(iss.tellg()) + "\"");
        }
    };

    if (iss >> type) {
        while (iss.rdbuf()->in_avail() && isblank(iss.peek()))
            iss.get();

        if (type == "undefined") {
            require_complete();
            return value::undefined;
        } else if (type == "null") {
            require_complete();
            return value::null;
        } else if (type == "boolean") {
            std::string val;
            if ((iss >> val) && (val == "true" || val == "false")) {
                require_complete();
                return mjs::value{val == "true"};
            }
        }
        if (type == "number" && iss.rdbuf()->in_avail()) {
            if (isalpha(iss.peek())) {
                std::string name;
                if (iss >> name) {
                    require_complete();
                    for (auto& c: name) c = static_cast<char>(tolower(c));
                    if (name == "infinity") return mjs::value{INFINITY};
                    if (name == "nan") return mjs::value{NAN};
                }
            } else {
                double val;
                if (iss >> val) {
                    require_complete();
                    return value{val};
                }
            }
        }
        if (type == "string" && iss.get() == '\'') {
            std::wstring res;
            bool escape = false;
            while (iss.rdbuf()->in_avail()) {
                const auto ch = static_cast<uint16_t>(iss.get());
                if (escape)  {
                    switch (ch) {
                    case 'b': res.push_back('\x08'); break;
                    case 't': res.push_back('\t'); break;
                    case 'n': res.push_back('\n'); break;
                    case 'v': res.push_back('\x0b'); break;
                    case 'f': res.push_back('\x0c'); break;
                    case 'r': res.push_back('\r'); break;
                    case 'u': res.push_back(get_escape_sequence(iss)); break;
                    case '\"': [[fallthrough]];
                    case '\'': [[fallthrough]];
                    case '\\': res.push_back(ch); break;
                    default:
                        NOT_IMPLEMENTED("Unhandled escape sequence \\" << (char)ch);
                    }
                    escape = false;
                } else if (ch == '\\') {
                    escape = true;
                } else if (ch == '\'') {
                    require_complete();
                    return value{mjs::string{h, res}};
                } else {
                    res.push_back(ch);
                }
            }
        }
    }
    throw std::runtime_error("Invalid test spec value \"" + s + "\"");
}